

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNewFixed
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ArrayNewFixed *curr)

{
  Type *this_00;
  size_t sVar1;
  Literal *pLVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  Literal local_f8;
  uintptr_t local_e0;
  HeapType heapType;
  Literal local_c8;
  undefined1 local_b0 [8];
  Literals data;
  
  uVar3 = (curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  uVar5 = (uint)uVar3;
  if (0x2aaaaa9 < uVar5) {
    (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
  }
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id == 1) {
    sVar1 = (curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar1 != 0) {
      uVar3 = 0;
      do {
        if ((curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= uVar3) goto LAB_001c3c6f;
        visit(__return_storage_ptr__,this,
              (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar3]
             );
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
          return __return_storage_ptr__;
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible)
        ;
        ::wasm::Literal::~Literal
                  ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                   _M_elems);
        uVar3 = uVar3 + 1;
      } while (sVar1 != uVar3);
    }
    ::wasm::handle_unreachable
              ("unreachable but no unreachable child",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x778);
  }
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type;
  local_e0 = (uintptr_t)Type::getHeapType(this_00);
  ::wasm::HeapType::getArray();
  SmallVector<wasm::Literal,_1UL>::SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)local_b0,uVar3 & 0xffffffff);
  if (uVar5 != 0) {
    lVar4 = -0x18;
    uVar3 = 0;
    do {
      if ((curr->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar3) {
LAB_001c3c6f:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      visit(__return_storage_ptr__,this,
            (curr->values).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data[uVar3]);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_001c3c41;
      pLVar2 = Flow::getSingleValue(__return_storage_ptr__);
      ::wasm::Literal::Literal(&local_c8,pLVar2);
      truncateForPacking(&local_f8,this,&local_c8,(Field *)&heapType);
      pLVar2 = (Literal *)
               (data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar4);
      if ((int)uVar3 == 0) {
        pLVar2 = (Literal *)&data;
      }
      ::wasm::Literal::operator=(pLVar2,&local_f8);
      ::wasm::Literal::~Literal(&local_f8);
      ::wasm::Literal::~Literal(&local_c8);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible);
      ::wasm::Literal::~Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 != (uint)uVar3);
  }
  makeGCData((Literal *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,(Literals *)local_b0,(Type)this_00->id)
  ;
  Flow::Flow(__return_storage_ptr__,
             (Literal *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::wasm::Literal::~Literal
            ((Literal *)
             &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_001c3c41:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &data.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&data);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewFixed(ArrayNewFixed* curr) {
    NOTE_ENTER("ArrayNewFixed");
    Index num = curr->values.size();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* value : curr->values) {
        auto result = self()->visit(value);
        if (result.breaking()) {
          return result;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    auto field = heapType.getArray().element;
    Literals data(num);
    for (Index i = 0; i < num; i++) {
      auto value = self()->visit(curr->values[i]);
      if (value.breaking()) {
        return value;
      }
      data[i] = truncateForPacking(value.getSingleValue(), field);
    }
    return makeGCData(std::move(data), curr->type);
  }